

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O2

void __thiscall
vkt::tessellation::anon_unknown_0::initPrograms
          (anon_unknown_0 *this,SourceCollections *programCollection,CaseDefinition caseDef)

{
  SourceCollections *pSVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  byte bVar5;
  deUint32 variant;
  int iVar6;
  char *pcVar7;
  allocator<char> local_251;
  anon_unknown_0 *local_250;
  int local_244;
  string local_240;
  string local_220;
  SourceCollections *local_200;
  undefined1 local_1f8 [40];
  ulong local_1d0;
  char *local_1c8;
  char *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ostringstream src;
  
  local_250 = this;
  local_200 = programCollection;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  highp float in_v_attr;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out highp float in_tc_attr;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    in_tc_attr = in_v_attr;\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"vert",&local_251);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)local_250,&local_220);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1f8,&local_240);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1f8);
  std::__cxx11::string::~string((string *)(local_1f8 + 8));
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(vertices = 1) out;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in highp float in_tc_attr[];\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) patch out highp vec2 in_te_positionScale;\n"
                          );
  poVar3 = std::operator<<(poVar3,
                           "layout(location = 1) patch out highp vec2 in_te_positionOffset;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    in_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n"
                          );
  poVar3 = std::operator<<(poVar3,"    in_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n"
                          );
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[0] = in_tc_attr[0];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[1] = in_tc_attr[1];\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[0] = in_tc_attr[2];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[1] = in_tc_attr[3];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[2] = in_tc_attr[4];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[3] = in_tc_attr[5];\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"tesc",&local_251);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)local_250,&local_220);
  std::__cxx11::stringbuf::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_1f8,&local_240);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1f8);
  pSVar1 = local_200;
  local_1b8 = (ulong)local_200 >> 0x20;
  std::__cxx11::string::~string((string *)(local_1f8 + 8));
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  local_1b0 = caseDef._0_8_ >> 0x20;
  local_244 = (caseDef.spacingMode & SPACINGMODE_FRACTIONAL_ODD) + SPACINGMODE_FRACTIONAL_ODD;
  pcVar7 = (char *)0x0;
  pcVar2 = "cw";
  if (caseDef.primitiveType != TESSPRIMITIVETYPE_QUADS) {
    pcVar2 = pcVar7;
  }
  local_1c0 = "ccw";
  if (caseDef.primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    local_1c0 = pcVar2;
  }
  local_1c8 = "";
  if (((undefined1  [16])caseDef & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    local_1c8 = ", point_mode";
  }
  local_1d0 = (ulong)((uint)pSVar1 & 3);
  while (iVar6 = (int)pcVar7, local_244 != iVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    poVar3 = std::operator<<((ostream *)&src,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
    bVar5 = iVar6 == 1 & (byte)local_1b0;
    if (bVar5 != 0) {
      std::operator<<((ostream *)&src,"#extension GL_EXT_tessellation_point_size : require\n");
    }
    poVar3 = std::operator<<((ostream *)&src,"\n");
    poVar3 = std::operator<<(poVar3,"layout(");
    if ((uint)local_200 < 3) {
      pcVar2 = (char *)(&DAT_00c08b78)[local_1d0];
    }
    else {
      pcVar2 = (char *)0x0;
    }
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,", ");
    if ((uint)local_1b8 < 3) {
      pcVar2 = (&PTR_anon_var_dwarf_fe2586_00c08b90)[local_1b8];
    }
    else {
      pcVar2 = (char *)0x0;
    }
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,local_1c0);
    poVar3 = std::operator<<(poVar3,local_1c8);
    poVar3 = std::operator<<(poVar3,") in;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,
                             "layout(location = 0) patch in highp vec2 in_te_positionScale;\n");
    poVar3 = std::operator<<(poVar3,
                             "layout(location = 1) patch in highp vec2 in_te_positionOffset;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,
                             "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
                            );
    poVar3 = std::operator<<(poVar3,"    int  numInvocations;\n");
    poVar3 = std::operator<<(poVar3,"} sb_out;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    atomicAdd(sb_out.numInvocations, 1);\n");
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,
                    "    gl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n"
                   );
    if (bVar5 != 0) {
      std::operator<<((ostream *)&src,"    gl_PointSize = 1.0;\n");
    }
    std::operator<<((ostream *)&src,"}\n");
    pcVar2 = "tese";
    if (bVar5 != 0) {
      pcVar2 = "tese_psw";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,pcVar2,&local_251);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_250,&local_220);
    std::__cxx11::stringbuf::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_1f8,&local_240);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1f8);
    std::__cxx11::string::~string((string *)(local_1f8 + 8));
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
    pcVar7 = (char *)(ulong)(iVar6 + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out mediump vec4 o_color;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    o_color = vec4(1.0);\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"frag",&local_251);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)local_250,&local_220);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1f8,&local_240);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1f8);
  std::__cxx11::string::~string((string *)(local_1f8 + 8));
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void initPrograms (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp float in_v_attr;\n"
			<< "layout(location = 0) out highp float in_tc_attr;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_attr = in_v_attr;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(vertices = 1) out;\n"
			<< "\n"
			<< "layout(location = 0) in highp float in_tc_attr[];\n"
			<< "\n"
			<< "layout(location = 0) patch out highp vec2 in_te_positionScale;\n"
			<< "layout(location = 1) patch out highp vec2 in_te_positionOffset;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n"
			<< "    in_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n"
			<< "\n"
			<< "    gl_TessLevelInner[0] = in_tc_attr[0];\n"
			<< "    gl_TessLevelInner[1] = in_tc_attr[1];\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = in_tc_attr[2];\n"
			<< "    gl_TessLevelOuter[1] = in_tc_attr[3];\n"
			<< "    gl_TessLevelOuter[2] = in_tc_attr[4];\n"
			<< "    gl_TessLevelOuter[3] = in_tc_attr[5];\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	// When using point mode we need two variants of the shader, one for the case where
	// shaderTessellationAndGeometryPointSize is enabled (in which the tessellation evaluation
	// shader needs to write to gl_PointSize for it to be defined) and one for the case where
	// it is disabled, in which we can't write to gl_PointSize but it has a default value
	// of 1.0
	{
		const deUint32	numVariants			= caseDef.usePointMode ? 2 : 1;
		for (deUint32 variant = 0; variant < numVariants; variant++)
		{
			const bool	needPointSizeWrite	= caseDef.usePointMode && variant == 1;

			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_tessellation_shader : require\n";
			if (needPointSizeWrite)
			{
				src << "#extension GL_EXT_tessellation_point_size : require\n";
			}
			src << "\n"
				<< "layout(" << getTessPrimitiveTypeShaderName(caseDef.primitiveType) << ", "
							 << getSpacingModeShaderName(caseDef.spacingMode) << ", "
							 << getWindingShaderName(caseDef.winding)
							 << (caseDef.usePointMode ? ", point_mode" : "") << ") in;\n"
				<< "\n"
				<< "layout(location = 0) patch in highp vec2 in_te_positionScale;\n"
				<< "layout(location = 1) patch in highp vec2 in_te_positionOffset;\n"
				<< "\n"
				<< "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
				<< "    int  numInvocations;\n"
				<< "} sb_out;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    atomicAdd(sb_out.numInvocations, 1);\n"
				<< "\n"
				<< "    gl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n";
			if (needPointSizeWrite)
			{
				src << "    gl_PointSize = 1.0;\n";
			}
			src << "}\n";

			programCollection.glslSources.add(needPointSizeWrite ? "tese_psw" : "tese") << glu::TessellationEvaluationSource(src.str());
		}
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) out mediump vec4 o_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = vec4(1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}